

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServerSocket.cpp
# Opt level: O1

int __thiscall
mognetwork::TcpServerSocket::accept
          (TcpServerSocket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  SocketFD __fd_00;
  int fd;
  TcpSocket *this_00;
  socklen_t sinsize;
  sockaddr_in csin;
  socklen_t local_2c;
  sockaddr local_28;
  
  local_28.sa_family = 0;
  local_28.sa_data[0] = '\0';
  local_28.sa_data[1] = '\0';
  local_28.sa_data[2] = '\0';
  local_28.sa_data[3] = '\0';
  local_28.sa_data[4] = '\0';
  local_28.sa_data[5] = '\0';
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  local_2c = 0x10;
  __fd_00 = Socket::getSocketFD((Socket *)this);
  fd = ::accept(__fd_00,&local_28,&local_2c);
  if (fd == -1) {
    this_00 = (TcpSocket *)0x0;
  }
  else {
    this_00 = (TcpSocket *)operator_new(0xa0);
    TcpSocket::TcpSocket(this_00,fd);
  }
  return (int)this_00;
}

Assistant:

TcpSocket* TcpServerSocket::accept()
  {
    sockaddr_in csin;
    memset(&csin, 0, sizeof(csin));
    socklen_t sinsize = sizeof(csin);
    SocketFD cSocket;
    if ((cSocket = ::accept(getSocketFD(), (sockaddr*)&csin, &sinsize)) == -1)
      return NULL;
    return new TcpSocket(cSocket);
  }